

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutokeyCipher.cpp
# Opt level: O2

int __thiscall
AutokeyCipher::decrypt
          (AutokeyCipher *this,EVP_PKEY_CTX *ctx,uchar *out,size_t *outlen,uchar *in,size_t inlen)

{
  ulong uVar1;
  ulong uVar2;
  
  std::__cxx11::string::string((string *)this,(string *)out);
  uVar2 = 0;
  uVar1 = (ulong)*(uint *)(out + 8);
  if ((int)*(uint *)(out + 8) < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    (this->key)._M_dataplus._M_p[uVar2] =
         (char)((int)(short)(((short)*(char *)(*(long *)out + uVar2) -
                             (short)*(char *)(*(long *)ctx + uVar2)) + 0x1a) % 0x1a) + 'a';
  }
  return (int)this;
}

Assistant:

string AutokeyCipher::decrypt(const string& str) { // Decrypt a string
    string decrypted = str;

    // Subtract key from msg (cyclic)
    int str_len = str.length();
    for(int i=0; i<str_len; ++i){
        decrypted[i] = FIRST_LETTER + (str[i] - key[i] + TOTAL_LETTERS)%TOTAL_LETTERS;
    }

    return decrypted;
}